

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Textures.cpp
# Opt level: O1

SP __thiscall pbrt::SemanticParser::createTexture_constant(SemanticParser *this,SP *in)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  element_type *peVar3;
  bool bVar4;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  float fVar6;
  SP SVar7;
  SP tex;
  string local_58;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  
  std::__shared_ptr<pbrt::ConstantTexture,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<pbrt::ConstantTexture>>
            ((__shared_ptr<pbrt::ConstantTexture,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (allocator<pbrt::ConstantTexture> *)&local_58);
  lVar2 = *in_RDX;
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"value","");
  bVar4 = syntactic::ParamSet::hasParam1f((ParamSet *)(lVar2 + 8),&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  peVar3 = local_38;
  lVar2 = *in_RDX;
  if (bVar4) {
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"value","");
    fVar6 = syntactic::ParamSet::getParam1f((ParamSet *)(lVar2 + 8),&local_58,0.0);
    *(float *)&(local_38->cameras).
               super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
               ._M_impl.super__Vector_impl_data._M_start = fVar6;
    *(float *)((long)&(local_38->cameras).
                      super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                      ._M_impl.super__Vector_impl_data + 4) = fVar6;
    *(float *)((long)&(local_38->cameras).
                      super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                      ._M_impl.super__Vector_impl_data + 8) = fVar6;
    _Var5._M_pi = extraout_RDX;
  }
  else {
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"value","");
    syntactic::ParamSet::getParam3f((ParamSet *)(lVar2 + 8),(float *)&peVar3->cameras,&local_58);
    _Var5._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    _Var5._M_pi = extraout_RDX_01;
  }
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_38;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_30;
  SVar7.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  SVar7.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar7.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Texture::SP SemanticParser::createTexture_constant(pbrt::syntactic::Texture::SP in)
  {
    ConstantTexture::SP tex = std::make_shared<ConstantTexture>();
    if (in->hasParam1f("value"))
      tex->value = vec3f(in->getParam1f("value"));
    else
      in->getParam3f(&tex->value.x,"value");
    return tex;
  }